

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.cpp
# Opt level: O0

bool rsg::anon_unknown_13::
     compareValueRangesAllTrue<rsg::(anonymous_namespace)::CompareIntersection>
               (ConstValueRangeAccess *a,ConstValueRangeAccess *b)

{
  bool bVar1;
  Type TVar2;
  VariableType *pVVar3;
  vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_> *this;
  size_type sVar4;
  CompareIntersection local_2e9;
  ConstValueRangeAccess local_2e8;
  ConstValueAccess local_2d0;
  undefined1 local_2b9;
  undefined1 local_2b8 [7];
  bool bMax_2;
  ConstValueAccess local_2a0;
  byte local_289;
  undefined1 local_288 [7];
  bool bMin_2;
  ConstValueAccess local_270;
  byte local_259;
  undefined1 local_258 [7];
  bool aMax_2;
  ConstValueAccess local_240;
  byte local_229;
  int local_228;
  bool aMin_2;
  int ndx_4;
  ConstValueAccess local_208;
  int local_1f4;
  undefined1 local_1f0 [4];
  int bMax_1;
  ConstValueAccess local_1d8;
  int local_1c4;
  undefined1 local_1c0 [4];
  int bMin_1;
  ConstValueAccess local_1a8;
  int local_194;
  undefined1 local_190 [4];
  int aMax_1;
  ConstValueAccess local_178;
  int local_164;
  int local_160;
  int aMin_1;
  int ndx_3;
  ConstValueAccess local_140;
  float local_12c;
  undefined1 local_128 [4];
  float bMax;
  ConstValueAccess local_110;
  float local_fc;
  undefined1 local_f8 [4];
  float bMin;
  ConstValueAccess local_e0;
  float local_cc;
  undefined1 local_c8 [4];
  float aMax;
  ConstValueAccess local_b0;
  float local_9c;
  int local_98;
  float aMin;
  int ndx_2;
  int numElements_1;
  ConstValueRangeAccess local_78;
  int local_60;
  int local_5c;
  int ndx_1;
  int numElements;
  ConstValueRangeAccess local_40;
  int local_28;
  int local_24;
  int ndx;
  int numMembers;
  ConstValueRangeAccess *b_local;
  ConstValueRangeAccess *a_local;
  
  _ndx = b;
  b_local = a;
  pVVar3 = ConstValueRangeAccess::getType(a);
  bVar1 = VariableType::isStruct(pVVar3);
  if (bVar1) {
    pVVar3 = ConstValueRangeAccess::getType(b_local);
    this = VariableType::getMembers(pVVar3);
    sVar4 = std::vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>::size
                      (this);
    local_24 = (int)sVar4;
    for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
      ConstValueRangeAccess::member(&local_40,b_local,local_28);
      ConstValueRangeAccess::member((ConstValueRangeAccess *)&ndx_1,_ndx,local_28);
      bVar1 = compareValueRangesAllTrue<rsg::(anonymous_namespace)::CompareIntersection>
                        (&local_40,(ConstValueRangeAccess *)&ndx_1);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return false;
      }
    }
  }
  else {
    pVVar3 = ConstValueRangeAccess::getType(b_local);
    bVar1 = VariableType::isArray(pVVar3);
    if (bVar1) {
      pVVar3 = ConstValueRangeAccess::getType(b_local);
      local_5c = VariableType::getNumElements(pVVar3);
      for (local_60 = 0; local_60 < local_5c; local_60 = local_60 + 1) {
        ConstValueRangeAccess::arrayElement(&local_78,b_local,local_60);
        ConstValueRangeAccess::arrayElement((ConstValueRangeAccess *)&ndx_2,_ndx,local_60);
        bVar1 = compareValueRangesAllTrue<rsg::(anonymous_namespace)::CompareIntersection>
                          (&local_78,(ConstValueRangeAccess *)&ndx_2);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          return false;
        }
      }
    }
    else {
      pVVar3 = ConstValueRangeAccess::getType(b_local);
      aMin = (float)VariableType::getNumElements(pVVar3);
      pVVar3 = ConstValueRangeAccess::getType(b_local);
      TVar2 = VariableType::getBaseType(pVVar3);
      switch(TVar2) {
      case TYPE_FLOAT:
        for (local_98 = 0; local_98 < (int)aMin; local_98 = local_98 + 1) {
          ConstValueRangeAccess::component((ConstValueRangeAccess *)local_c8,b_local,local_98);
          local_b0 = ConstValueRangeAccess::getMin((ConstValueRangeAccess *)local_c8);
          local_9c = ConstStridedValueAccess<1>::asFloat(&local_b0);
          ConstValueRangeAccess::component((ConstValueRangeAccess *)local_f8,b_local,local_98);
          local_e0 = ConstValueRangeAccess::getMax((ConstValueRangeAccess *)local_f8);
          local_cc = ConstStridedValueAccess<1>::asFloat(&local_e0);
          ConstValueRangeAccess::component((ConstValueRangeAccess *)local_128,_ndx,local_98);
          local_110 = ConstValueRangeAccess::getMin((ConstValueRangeAccess *)local_128);
          local_fc = ConstStridedValueAccess<1>::asFloat(&local_110);
          ConstValueRangeAccess::component((ConstValueRangeAccess *)&ndx_3,_ndx,local_98);
          local_140 = ConstValueRangeAccess::getMax((ConstValueRangeAccess *)&ndx_3);
          local_12c = ConstStridedValueAccess<1>::asFloat(&local_140);
          bVar1 = CompareIntersection::operator()
                            ((CompareIntersection *)((long)&aMin_1 + 3),local_9c,local_cc,local_fc,
                             local_12c);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            return false;
          }
        }
        break;
      case TYPE_INT:
      case TYPE_SAMPLER_2D:
      case TYPE_SAMPLER_CUBE:
        for (local_160 = 0; local_160 < (int)aMin; local_160 = local_160 + 1) {
          ConstValueRangeAccess::component((ConstValueRangeAccess *)local_190,b_local,local_160);
          local_178 = ConstValueRangeAccess::getMin((ConstValueRangeAccess *)local_190);
          local_164 = ConstStridedValueAccess<1>::asInt(&local_178);
          ConstValueRangeAccess::component((ConstValueRangeAccess *)local_1c0,b_local,local_160);
          local_1a8 = ConstValueRangeAccess::getMax((ConstValueRangeAccess *)local_1c0);
          local_194 = ConstStridedValueAccess<1>::asInt(&local_1a8);
          ConstValueRangeAccess::component((ConstValueRangeAccess *)local_1f0,_ndx,local_160);
          local_1d8 = ConstValueRangeAccess::getMin((ConstValueRangeAccess *)local_1f0);
          local_1c4 = ConstStridedValueAccess<1>::asInt(&local_1d8);
          ConstValueRangeAccess::component((ConstValueRangeAccess *)&ndx_4,_ndx,local_160);
          local_208 = ConstValueRangeAccess::getMax((ConstValueRangeAccess *)&ndx_4);
          local_1f4 = ConstStridedValueAccess<1>::asInt(&local_208);
          bVar1 = CompareIntersection::operator()
                            ((CompareIntersection *)&aMin_2,local_164,local_194,local_1c4,local_1f4)
          ;
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            return false;
          }
        }
        break;
      case TYPE_BOOL:
        for (local_228 = 0; local_228 < (int)aMin; local_228 = local_228 + 1) {
          ConstValueRangeAccess::component((ConstValueRangeAccess *)local_258,b_local,local_228);
          local_240 = ConstValueRangeAccess::getMin((ConstValueRangeAccess *)local_258);
          local_229 = ConstStridedValueAccess<1>::asBool(&local_240);
          ConstValueRangeAccess::component((ConstValueRangeAccess *)local_288,b_local,local_228);
          local_270 = ConstValueRangeAccess::getMax((ConstValueRangeAccess *)local_288);
          local_259 = ConstStridedValueAccess<1>::asBool(&local_270);
          ConstValueRangeAccess::component((ConstValueRangeAccess *)local_2b8,_ndx,local_228);
          local_2a0 = ConstValueRangeAccess::getMin((ConstValueRangeAccess *)local_2b8);
          local_289 = ConstStridedValueAccess<1>::asBool(&local_2a0);
          ConstValueRangeAccess::component(&local_2e8,_ndx,local_228);
          local_2d0 = ConstValueRangeAccess::getMax(&local_2e8);
          local_2b9 = ConstStridedValueAccess<1>::asBool(&local_2d0);
          bVar1 = CompareIntersection::operator()
                            (&local_2e9,(bool)(local_229 & 1),(bool)(local_259 & 1),
                             (bool)(local_289 & 1),(bool)local_2b9);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            return false;
          }
        }
        break;
      default:
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool compareValueRangesAllTrue (const ConstValueRangeAccess& a, const ConstValueRangeAccess& b)
{
	DE_ASSERT(a.getType() == b.getType());

	if (a.getType().isStruct())
	{
		int numMembers = (int)a.getType().getMembers().size();
		for (int ndx = 0; ndx < numMembers; ndx++)
		{
			if (!compareValueRangesAllTrue<CompareOp>(a.member(ndx), b.member(ndx)))
				return false;
		}
	}
	else if (a.getType().isArray())
	{
		int numElements = (int)a.getType().getNumElements();
		for (int ndx = 0; ndx < numElements; ndx++)
		{
			if (!compareValueRangesAllTrue<CompareOp>(a.arrayElement(ndx), b.arrayElement(ndx)))
				return false;
		}
	}
	else
	{
		int numElements = (int)a.getType().getNumElements();
		switch (a.getType().getBaseType())
		{
			case VariableType::TYPE_FLOAT:
				for (int ndx = 0; ndx < numElements; ndx++)
				{
					float aMin = a.component(ndx).getMin().asFloat();
					float aMax = a.component(ndx).getMax().asFloat();
					float bMin = b.component(ndx).getMin().asFloat();
					float bMax = b.component(ndx).getMax().asFloat();

					if (!CompareOp()(aMin, aMax, bMin, bMax))
						return false;
				}
				break;

			case VariableType::TYPE_INT:
			case VariableType::TYPE_SAMPLER_2D:
			case VariableType::TYPE_SAMPLER_CUBE:
				for (int ndx = 0; ndx < numElements; ndx++)
				{
					int aMin = a.component(ndx).getMin().asInt();
					int aMax = a.component(ndx).getMax().asInt();
					int bMin = b.component(ndx).getMin().asInt();
					int bMax = b.component(ndx).getMax().asInt();

					if (!CompareOp()(aMin, aMax, bMin, bMax))
						return false;
				}
				break;

			case VariableType::TYPE_BOOL:
				for (int ndx = 0; ndx < numElements; ndx++)
				{
					bool aMin = a.component(ndx).getMin().asBool();
					bool aMax = a.component(ndx).getMax().asBool();
					bool bMin = b.component(ndx).getMin().asBool();
					bool bMax = b.component(ndx).getMax().asBool();

					if (!CompareOp()(aMin, aMax, bMin, bMax))
						return false;
				}
				break;

			default:
				DE_ASSERT(DE_FALSE);
				return false;
		}
	}

	return true;
}